

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

file_format_t __thiscall
cfgfile::details::determine_format_t<cfgfile::string_trait_t>::format
          (determine_format_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  int iVar2;
  undefined8 *in_RDI;
  char_t ch;
  istream_t *in_stack_ffffffffffffffc8;
  char local_1d [25];
  file_format_t local_4;
  
  if ((format()::xml == '\0') && (iVar2 = __cxa_guard_acquire(&format()::xml), iVar2 != 0)) {
    format::xml = string_trait_t::from_ascii('<');
    __cxa_guard_release(&format()::xml);
  }
  local_1d[0] = '\0';
  do {
    bVar1 = string_trait_t::is_at_end(in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return cfgfile_format;
    }
    std::operator>>((istream *)*in_RDI,local_1d);
    bVar1 = string_trait_t::is_space('\0');
  } while (bVar1);
  local_4 = (file_format_t)(local_1d[0] == format::xml);
  return local_4;
}

Assistant:

file_format_t format()
	{
		static const typename Trait::char_t xml = Trait::from_ascii( '<' );

		typename Trait::char_t ch( 0x00 );

		while( !Trait::is_at_end( m_stream ) )
		{
			m_stream >> ch;

			if( Trait::is_space( ch ) )
				continue;

			if( ch == xml )
				return file_format_t::xml_format;
			else
				return file_format_t::cfgfile_format;
		}

		return file_format_t::cfgfile_format;
	}